

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O1

size_t interp_compress(uint8_t *obuff,size_t osize,uint32_t *ibuff,size_t isize)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> T;
  allocator_type local_31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  undefined1 auVar9 [32];
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_30,isize * 2 - 1,&local_31);
  if (isize != 0) {
    auVar11 = vpbroadcastq_avx512f();
    uVar4 = 0;
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar13 = vpbroadcastq_avx512f();
      auVar13 = vporq_avx512f(auVar13,auVar12);
      uVar6 = vpcmpuq_avx512f(auVar13,auVar11,2);
      auVar9 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(ibuff + uVar4));
      auVar10._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar9._4_4_;
      auVar10._0_4_ = (uint)((byte)uVar6 & 1) * auVar9._0_4_;
      auVar10._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar9._8_4_;
      auVar10._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar9._12_4_;
      auVar10._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar9._16_4_;
      auVar10._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar9._20_4_;
      auVar10._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar9._24_4_;
      auVar10._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar9._28_4_;
      auVar13 = vpmovzxdq_avx512f(auVar10);
      auVar13 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])
       (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start + isize + (uVar4 - 1)) = auVar13;
      uVar4 = uVar4 + 8;
    } while ((isize + 7 & 0xfffffffffffffff8) != uVar4);
  }
  uVar2 = (int)isize - 2;
  if (-1 < (int)uVar2) {
    lVar5 = (ulong)uVar2 * 8 + 8;
    lVar7 = (ulong)uVar2 + 1;
    do {
      local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7 + -1] =
           *(long *)((long)local_30.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar5 * 2 + -8) + -1 +
           *(long *)((long)local_30.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar5 * 2);
      lVar5 = lVar5 + -8;
      lVar3 = lVar7 + -1;
      bVar1 = 0 < lVar7;
      lVar7 = lVar3;
    } while (lVar3 != 0 && bVar1);
  }
  uVar4 = *local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start - 1;
  lVar5 = 0;
  do {
    obuff[lVar5] = (uint8_t)uVar4;
    lVar5 = lVar5 + 1;
    uVar4 = uVar4 >> 8;
  } while (lVar5 != 8);
  sVar8 = 8;
  if (isize != 1) {
    lVar5 = 0;
    do {
      if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] - 1 == 0) {
        lVar7 = 0;
      }
      else {
        uVar4 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5 * 2 + 2];
        uVar6 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5 * 2 + 1];
        lVar7 = (uVar4 - uVar6) + 1;
        if (uVar4 < uVar6) {
          lVar7 = -(uVar4 - uVar6);
        }
        uVar6 = lVar7 - 1;
        lVar7 = 0;
        uVar4 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] - 1;
        do {
          obuff[lVar7 + sVar8] = (uint8_t)uVar6;
          lVar7 = lVar7 + 1;
          uVar6 = uVar6 >> 8;
          bVar1 = 0xff < uVar4;
          uVar4 = uVar4 >> 8;
        } while (bVar1);
      }
      sVar8 = sVar8 + lVar7;
      lVar5 = lVar5 + 1;
    } while (lVar5 != isize - 1);
  }
  operator_delete(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return sVar8;
}

Assistant:

size_t interp_compress(uint8_t* obuff, /* output buffer */
    size_t osize, /* output buffer size */
    const uint32_t* ibuff, /* input buffer */
    size_t isize)
{ /* input buffer size */

    int i, p;
    uint64_t vp, vl, vr, v;
    size_t op = 0;

    std::vector<uint64_t> T(2 * isize - 1);

    for (i = 0; i < isize; i++) {
        T[i + isize - 1] = ibuff[i];
    }
    for (p = isize - 2; p >= 0; p--) {
        T[p] = T[2 * p + 1] + T[2 * p + 2] - 1;
    }
    op += byte_encode(obuff, osize - op, T[0], (1LL << 63));
    for (p = 0; p < isize - 1; p++) {
        vp = T[p];
        vl = T[2 * p + 1];
        vr = T[2 * p + 2];
        if (vl <= vr) {
            v = vr - vl + 1;
        } else {
            v = vl - vr;
        }
        op += byte_encode(obuff + op, osize - op, v, vp);
    }
    return op;
}